

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::nonbasicValue(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *__return_storage_ptr__,
               SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  uint *puVar1;
  uint uVar2;
  Status SVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  pointer pnVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  pointer pnVar16;
  cpp_dec_float<100U,_int,_void> *pcVar17;
  ulong uVar18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  if (this->m_nonbasicValueUpToDate == true) {
    uVar4 = *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems;
    uVar5 = *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2);
    uVar6 = *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4);
    uVar7 = *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6);
    uVar8 = *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8);
    uVar9 = *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 10);
    uVar10 = *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xe);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xc);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) = uVar10;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) = uVar8;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) = uVar9;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = uVar6;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar7;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar4;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar5;
    (__return_storage_ptr__->m_backend).exp = (this->m_nonbasicValue).m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = (this->m_nonbasicValue).m_backend.neg;
    iVar11 = (this->m_nonbasicValue).m_backend.prec_elem;
    (__return_storage_ptr__->m_backend).fpclass = (this->m_nonbasicValue).m_backend.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = iVar11;
  }
  else {
    local_38 = __return_storage_ptr__;
    if (this->theRep == COLUMN) {
      uVar2 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      uVar14 = (ulong)uVar2;
      if (this->theType == LEAVE) {
        if (0 < (int)uVar2) {
          uVar18 = uVar14 + 1;
          lVar13 = uVar14 * 0x50;
          do {
            uVar14 = uVar14 - 1;
            SVar3 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data[uVar18 - 2];
            if (SVar3 == P_FIXED) {
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_003c65d0:
              pnVar16 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_003c65d7:
              pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)&pnVar16[-1].m_backend.data + lVar13);
              local_d8.fpclass = cpp_dec_float_finite;
              local_d8.prec_elem = 0x10;
              local_d8.data._M_elems[0] = 0;
              local_d8.data._M_elems[1] = 0;
              local_d8.data._M_elems[2] = 0;
              local_d8.data._M_elems[3] = 0;
              local_d8.data._M_elems[4] = 0;
              local_d8.data._M_elems[5] = 0;
              local_d8.data._M_elems[6] = 0;
              local_d8.data._M_elems[7] = 0;
              local_d8.data._M_elems[8] = 0;
              local_d8.data._M_elems[9] = 0;
              local_d8.data._M_elems[10] = 0;
              local_d8.data._M_elems[0xb] = 0;
              local_d8.data._M_elems[0xc] = 0;
              local_d8.data._M_elems[0xd] = 0;
              local_d8.data._M_elems._56_5_ = 0;
              local_d8.data._M_elems[0xf]._1_3_ = 0;
              local_d8.exp = 0;
              local_d8.neg = false;
              if (pcVar17 == &local_d8) {
                pcVar17 = &pnVar12[uVar14].m_backend;
              }
              else {
                puVar1 = (uint *)((long)&pnVar12[-1].m_backend.data + lVar13);
                if ((cpp_dec_float<100U,_int,_void> *)puVar1 != &local_d8) {
                  local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                  local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                  local_d8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                  local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 6);
                  local_d8.data._M_elems._32_8_ = *(undefined8 *)(puVar1 + 8);
                  local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 10);
                  local_d8.data._M_elems._48_8_ = *(undefined8 *)(puVar1 + 0xc);
                  local_d8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar1 + 0xe),0);
                  local_d8.data._M_elems[0xf]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 0xe) >> 0x28);
                  local_d8.exp = *(int *)((long)&pnVar12[-1].m_backend.data + lVar13 + 0x40);
                  local_d8.neg = *(bool *)((long)&pnVar12[-1].m_backend.data + lVar13 + 0x44);
                  local_d8._72_8_ =
                       *(undefined8 *)((long)&pnVar12[-1].m_backend.data + lVar13 + 0x48);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        (&local_d8,pcVar17);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_88,&local_d8);
            }
            else {
              if (SVar3 == P_ON_LOWER) {
                pnVar12 = (this->theLCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_003c65d0;
              }
              if (SVar3 == P_ON_UPPER) {
                pnVar12 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar16 = (this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_003c65d7;
              }
            }
            uVar18 = uVar18 - 1;
            lVar13 = lVar13 + -0x50;
          } while (1 < uVar18);
        }
        lVar13 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar13) {
          uVar14 = lVar13 + 1;
          lVar15 = lVar13 * 0x50;
          do {
            lVar13 = lVar13 + -1;
            SVar3 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data[uVar14 - 2];
            if (SVar3 == P_FIXED) {
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_003c66f4:
              pnVar16 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_003c66f8:
              pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)&pnVar16[-1].m_backend.data + lVar15);
              local_d8.fpclass = cpp_dec_float_finite;
              local_d8.prec_elem = 0x10;
              local_d8.data._M_elems[0] = 0;
              local_d8.data._M_elems[1] = 0;
              local_d8.data._M_elems[2] = 0;
              local_d8.data._M_elems[3] = 0;
              local_d8.data._M_elems[4] = 0;
              local_d8.data._M_elems[5] = 0;
              local_d8.data._M_elems[6] = 0;
              local_d8.data._M_elems[7] = 0;
              local_d8.data._M_elems[8] = 0;
              local_d8.data._M_elems[9] = 0;
              local_d8.data._M_elems[10] = 0;
              local_d8.data._M_elems[0xb] = 0;
              local_d8.data._M_elems[0xc] = 0;
              local_d8.data._M_elems[0xd] = 0;
              local_d8.data._M_elems._56_5_ = 0;
              local_d8.data._M_elems[0xf]._1_3_ = 0;
              local_d8.exp = 0;
              local_d8.neg = false;
              if (pcVar17 == &local_d8) {
                pcVar17 = &pnVar12[lVar13].m_backend;
              }
              else {
                puVar1 = (uint *)((long)&pnVar12[-1].m_backend.data + lVar15);
                if ((cpp_dec_float<100U,_int,_void> *)puVar1 != &local_d8) {
                  local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                  local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                  local_d8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                  local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 6);
                  local_d8.data._M_elems._32_8_ = *(undefined8 *)(puVar1 + 8);
                  local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 10);
                  local_d8.data._M_elems._48_8_ = *(undefined8 *)(puVar1 + 0xc);
                  local_d8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar1 + 0xe),0);
                  local_d8.data._M_elems[0xf]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 0xe) >> 0x28);
                  local_d8.exp = *(int *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x40);
                  local_d8.neg = *(bool *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x44);
                  local_d8._72_8_ =
                       *(undefined8 *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x48);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        (&local_d8,pcVar17);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_88,&local_d8);
            }
            else {
              if (SVar3 == P_ON_LOWER) {
                pnVar12 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_003c66f4;
              }
              if (SVar3 == P_ON_UPPER) {
                pnVar12 = (this->theLRbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar16 = (this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_003c66f8;
              }
            }
            uVar14 = uVar14 - 1;
            lVar15 = lVar15 + -0x50;
          } while (1 < uVar14);
        }
      }
      else {
        if (0 < (int)uVar2) {
          uVar18 = uVar14 + 1;
          lVar13 = uVar14 * 0x50;
          do {
            uVar14 = uVar14 - 1;
            SVar3 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data[uVar18 - 2];
            if ((SVar3 == P_FIXED) || (SVar3 == P_ON_LOWER)) {
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar16 = (this->theLCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_003c6d20:
              pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)&pnVar16[-1].m_backend.data + lVar13);
              local_d8.fpclass = cpp_dec_float_finite;
              local_d8.prec_elem = 0x10;
              local_d8.data._M_elems[0] = 0;
              local_d8.data._M_elems[1] = 0;
              local_d8.data._M_elems[2] = 0;
              local_d8.data._M_elems[3] = 0;
              local_d8.data._M_elems[4] = 0;
              local_d8.data._M_elems[5] = 0;
              local_d8.data._M_elems[6] = 0;
              local_d8.data._M_elems[7] = 0;
              local_d8.data._M_elems[8] = 0;
              local_d8.data._M_elems[9] = 0;
              local_d8.data._M_elems[10] = 0;
              local_d8.data._M_elems[0xb] = 0;
              local_d8.data._M_elems[0xc] = 0;
              local_d8.data._M_elems[0xd] = 0;
              local_d8.data._M_elems._56_5_ = 0;
              local_d8.data._M_elems[0xf]._1_3_ = 0;
              local_d8.exp = 0;
              local_d8.neg = false;
              if (pcVar17 == &local_d8) {
                pcVar17 = &pnVar12[uVar14].m_backend;
              }
              else {
                puVar1 = (uint *)((long)&pnVar12[-1].m_backend.data + lVar13);
                if ((cpp_dec_float<100U,_int,_void> *)puVar1 != &local_d8) {
                  local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                  local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                  local_d8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                  local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 6);
                  local_d8.data._M_elems._32_8_ = *(undefined8 *)(puVar1 + 8);
                  local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 10);
                  local_d8.data._M_elems._48_8_ = *(undefined8 *)(puVar1 + 0xc);
                  local_d8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar1 + 0xe),0);
                  local_d8.data._M_elems[0xf]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 0xe) >> 0x28);
                  local_d8.exp = *(int *)((long)&pnVar12[-1].m_backend.data + lVar13 + 0x40);
                  local_d8.neg = *(bool *)((long)&pnVar12[-1].m_backend.data + lVar13 + 0x44);
                  local_d8._72_8_ =
                       *(undefined8 *)((long)&pnVar12[-1].m_backend.data + lVar13 + 0x48);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        (&local_d8,pcVar17);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_88,&local_d8);
            }
            else if (SVar3 == P_ON_UPPER) {
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar16 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_003c6d20;
            }
            uVar18 = uVar18 - 1;
            lVar13 = lVar13 + -0x50;
          } while (1 < uVar18);
        }
        lVar13 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar13) {
          uVar14 = lVar13 + 1;
          lVar15 = lVar13 * 0x50;
          do {
            lVar13 = lVar13 + -1;
            SVar3 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data[uVar14 - 2];
            if ((SVar3 == P_FIXED) || (SVar3 == P_ON_LOWER)) {
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar16 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_003c6e3d:
              pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)&pnVar16[-1].m_backend.data + lVar15);
              local_d8.fpclass = cpp_dec_float_finite;
              local_d8.prec_elem = 0x10;
              local_d8.data._M_elems[0] = 0;
              local_d8.data._M_elems[1] = 0;
              local_d8.data._M_elems[2] = 0;
              local_d8.data._M_elems[3] = 0;
              local_d8.data._M_elems[4] = 0;
              local_d8.data._M_elems[5] = 0;
              local_d8.data._M_elems[6] = 0;
              local_d8.data._M_elems[7] = 0;
              local_d8.data._M_elems[8] = 0;
              local_d8.data._M_elems[9] = 0;
              local_d8.data._M_elems[10] = 0;
              local_d8.data._M_elems[0xb] = 0;
              local_d8.data._M_elems[0xc] = 0;
              local_d8.data._M_elems[0xd] = 0;
              local_d8.data._M_elems._56_5_ = 0;
              local_d8.data._M_elems[0xf]._1_3_ = 0;
              local_d8.exp = 0;
              local_d8.neg = false;
              if (pcVar17 == &local_d8) {
                pcVar17 = &pnVar12[lVar13].m_backend;
              }
              else {
                puVar1 = (uint *)((long)&pnVar12[-1].m_backend.data + lVar15);
                if ((cpp_dec_float<100U,_int,_void> *)puVar1 != &local_d8) {
                  local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                  local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                  local_d8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                  local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 6);
                  local_d8.data._M_elems._32_8_ = *(undefined8 *)(puVar1 + 8);
                  local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 10);
                  local_d8.data._M_elems._48_8_ = *(undefined8 *)(puVar1 + 0xc);
                  local_d8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar1 + 0xe),0);
                  local_d8.data._M_elems[0xf]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 0xe) >> 0x28);
                  local_d8.exp = *(int *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x40);
                  local_d8.neg = *(bool *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x44);
                  local_d8._72_8_ =
                       *(undefined8 *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x48);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        (&local_d8,pcVar17);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_88,&local_d8);
            }
            else if (SVar3 == P_ON_UPPER) {
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar16 = (this->theLRbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_003c6e3d;
            }
            uVar14 = uVar14 - 1;
            lVar15 = lVar15 + -0x50;
          } while (1 < uVar14);
        }
      }
    }
    else {
      lVar13 = (long)(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
      if (0 < lVar13) {
        uVar14 = lVar13 + 1;
        lVar15 = lVar13 * 0x50;
        do {
          lVar13 = lVar13 + -1;
          SVar3 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[uVar14 - 2];
          if (SVar3 == D_ON_BOTH) {
            pnVar12 = (this->theLCbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .up.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar15)
            ;
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            if (pcVar17 == &local_d8) {
              pcVar17 = &pnVar12[lVar13].m_backend;
            }
            else {
              puVar1 = (uint *)((long)&pnVar12[-1].m_backend.data + lVar15);
              if ((cpp_dec_float<100U,_int,_void> *)puVar1 != &local_d8) {
                local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                local_d8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 6);
                local_d8.data._M_elems._32_8_ = *(undefined8 *)(puVar1 + 8);
                local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 10);
                local_d8.data._M_elems._48_8_ = *(undefined8 *)(puVar1 + 0xc);
                local_d8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar1 + 0xe),0);
                local_d8.data._M_elems[0xf]._1_3_ =
                     (undefined3)((ulong)*(undefined8 *)(puVar1 + 0xe) >> 0x28);
                local_d8.exp = *(int *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x40);
                local_d8.neg = *(bool *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x44);
                local_d8._72_8_ = *(undefined8 *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x48)
                ;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_d8,pcVar17);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&local_88,&local_d8);
            pnVar12 = (this->theUCbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .low.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar15)
            ;
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            if (pcVar17 == &local_d8) {
              pcVar17 = &pnVar12[lVar13].m_backend;
            }
            else {
              puVar1 = (uint *)((long)&pnVar12[-1].m_backend.data + lVar15);
              if ((cpp_dec_float<100U,_int,_void> *)puVar1 != &local_d8) {
                local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                local_d8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 6);
                local_d8.data._M_elems._32_8_ = *(undefined8 *)(puVar1 + 8);
                local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 10);
                local_d8.data._M_elems._48_8_ = *(undefined8 *)(puVar1 + 0xc);
                local_d8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar1 + 0xe),0);
                local_d8.data._M_elems[0xf]._1_3_ =
                     (undefined3)((ulong)*(undefined8 *)(puVar1 + 0xe) >> 0x28);
                local_d8.exp = *(int *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x40);
                local_d8.neg = *(bool *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x44);
                local_d8._72_8_ = *(undefined8 *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x48)
                ;
              }
            }
LAB_003c6a11:
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_d8,pcVar17);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&local_88,&local_d8);
          }
          else {
            if (SVar3 == D_ON_LOWER) {
              pnVar12 = (this->theLCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar16 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_003c681e:
              pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)&pnVar16[-1].m_backend.data + lVar15);
              local_d8.fpclass = cpp_dec_float_finite;
              local_d8.prec_elem = 0x10;
              local_d8.data._M_elems[0] = 0;
              local_d8.data._M_elems[1] = 0;
              local_d8.data._M_elems[2] = 0;
              local_d8.data._M_elems[3] = 0;
              local_d8.data._M_elems[4] = 0;
              local_d8.data._M_elems[5] = 0;
              local_d8.data._M_elems[6] = 0;
              local_d8.data._M_elems[7] = 0;
              local_d8.data._M_elems[8] = 0;
              local_d8.data._M_elems[9] = 0;
              local_d8.data._M_elems[10] = 0;
              local_d8.data._M_elems[0xb] = 0;
              local_d8.data._M_elems[0xc] = 0;
              local_d8.data._M_elems[0xd] = 0;
              local_d8.data._M_elems._56_5_ = 0;
              local_d8.data._M_elems[0xf]._1_3_ = 0;
              local_d8.exp = 0;
              local_d8.neg = false;
              if (pcVar17 == &local_d8) {
                pcVar17 = &pnVar12[lVar13].m_backend;
              }
              else {
                puVar1 = (uint *)((long)&pnVar12[-1].m_backend.data + lVar15);
                if ((cpp_dec_float<100U,_int,_void> *)puVar1 != &local_d8) {
                  local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                  local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                  local_d8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                  local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 6);
                  local_d8.data._M_elems._32_8_ = *(undefined8 *)(puVar1 + 8);
                  local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 10);
                  local_d8.data._M_elems._48_8_ = *(undefined8 *)(puVar1 + 0xc);
                  local_d8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar1 + 0xe),0);
                  local_d8.data._M_elems[0xf]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 0xe) >> 0x28);
                  local_d8.exp = *(int *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x40);
                  local_d8.neg = *(bool *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x44);
                  local_d8._72_8_ =
                       *(undefined8 *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x48);
                }
              }
              goto LAB_003c6a11;
            }
            if (SVar3 == D_ON_UPPER) {
              pnVar12 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar16 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_003c681e;
            }
          }
          uVar14 = uVar14 - 1;
          lVar15 = lVar15 + -0x50;
        } while (1 < uVar14);
      }
      lVar13 = (long)(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
      if (0 < lVar13) {
        uVar14 = lVar13 + 1;
        lVar15 = lVar13 * 0x50;
        do {
          lVar13 = lVar13 + -1;
          SVar3 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[uVar14 - 2];
          if (SVar3 == D_ON_BOTH) {
            pnVar12 = (this->theLRbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .right.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar15)
            ;
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            if (pcVar17 == &local_d8) {
              pcVar17 = &pnVar12[lVar13].m_backend;
            }
            else {
              puVar1 = (uint *)((long)&pnVar12[-1].m_backend.data + lVar15);
              if ((cpp_dec_float<100U,_int,_void> *)puVar1 != &local_d8) {
                local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                local_d8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 6);
                local_d8.data._M_elems._32_8_ = *(undefined8 *)(puVar1 + 8);
                local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 10);
                local_d8.data._M_elems._48_8_ = *(undefined8 *)(puVar1 + 0xc);
                local_d8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar1 + 0xe),0);
                local_d8.data._M_elems[0xf]._1_3_ =
                     (undefined3)((ulong)*(undefined8 *)(puVar1 + 0xe) >> 0x28);
                local_d8.exp = *(int *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x40);
                local_d8.neg = *(bool *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x44);
                local_d8._72_8_ = *(undefined8 *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x48)
                ;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_d8,pcVar17);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&local_88,&local_d8);
            pnVar12 = (this->theURbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .left.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar15)
            ;
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            if (pcVar17 == &local_d8) {
              pcVar17 = &pnVar12[lVar13].m_backend;
            }
            else {
              puVar1 = (uint *)((long)&pnVar12[-1].m_backend.data + lVar15);
              if ((cpp_dec_float<100U,_int,_void> *)puVar1 != &local_d8) {
                local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                local_d8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 6);
                local_d8.data._M_elems._32_8_ = *(undefined8 *)(puVar1 + 8);
                local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 10);
                local_d8.data._M_elems._48_8_ = *(undefined8 *)(puVar1 + 0xc);
                local_d8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar1 + 0xe),0);
                local_d8.data._M_elems[0xf]._1_3_ =
                     (undefined3)((ulong)*(undefined8 *)(puVar1 + 0xe) >> 0x28);
                local_d8.exp = *(int *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x40);
                local_d8.neg = *(bool *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x44);
                local_d8._72_8_ = *(undefined8 *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x48)
                ;
              }
            }
LAB_003c6c91:
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_d8,pcVar17);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&local_88,&local_d8);
          }
          else {
            if (SVar3 == D_ON_LOWER) {
              pnVar12 = (this->theLRbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar16 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_003c6aa1:
              pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)&pnVar16[-1].m_backend.data + lVar15);
              local_d8.fpclass = cpp_dec_float_finite;
              local_d8.prec_elem = 0x10;
              local_d8.data._M_elems[0] = 0;
              local_d8.data._M_elems[1] = 0;
              local_d8.data._M_elems[2] = 0;
              local_d8.data._M_elems[3] = 0;
              local_d8.data._M_elems[4] = 0;
              local_d8.data._M_elems[5] = 0;
              local_d8.data._M_elems[6] = 0;
              local_d8.data._M_elems[7] = 0;
              local_d8.data._M_elems[8] = 0;
              local_d8.data._M_elems[9] = 0;
              local_d8.data._M_elems[10] = 0;
              local_d8.data._M_elems[0xb] = 0;
              local_d8.data._M_elems[0xc] = 0;
              local_d8.data._M_elems[0xd] = 0;
              local_d8.data._M_elems._56_5_ = 0;
              local_d8.data._M_elems[0xf]._1_3_ = 0;
              local_d8.exp = 0;
              local_d8.neg = false;
              if (pcVar17 == &local_d8) {
                pcVar17 = &pnVar12[lVar13].m_backend;
              }
              else {
                puVar1 = (uint *)((long)&pnVar12[-1].m_backend.data + lVar15);
                if ((cpp_dec_float<100U,_int,_void> *)puVar1 != &local_d8) {
                  local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                  local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                  local_d8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                  local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 6);
                  local_d8.data._M_elems._32_8_ = *(undefined8 *)(puVar1 + 8);
                  local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 10);
                  local_d8.data._M_elems._48_8_ = *(undefined8 *)(puVar1 + 0xc);
                  local_d8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar1 + 0xe),0);
                  local_d8.data._M_elems[0xf]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 0xe) >> 0x28);
                  local_d8.exp = *(int *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x40);
                  local_d8.neg = *(bool *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x44);
                  local_d8._72_8_ =
                       *(undefined8 *)((long)&pnVar12[-1].m_backend.data + lVar15 + 0x48);
                }
              }
              goto LAB_003c6c91;
            }
            if (SVar3 == D_ON_UPPER) {
              pnVar12 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar16 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_003c6aa1;
            }
          }
          uVar14 = uVar14 - 1;
          lVar15 = lVar15 + -0x50;
        } while (1 < uVar14);
      }
    }
    if (this->m_nonbasicValueUpToDate == false) {
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xc) =
           local_88.data._M_elems._48_8_;
      *(ulong *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xe) =
           CONCAT35(local_88.data._M_elems[0xf]._1_3_,local_88.data._M_elems._56_5_);
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) =
           local_88.data._M_elems._32_8_;
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 10) =
           local_88.data._M_elems._40_8_;
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) =
           local_88.data._M_elems._16_8_;
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) =
           local_88.data._M_elems._24_8_;
      *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems = local_88.data._M_elems._0_8_;
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) =
           local_88.data._M_elems._8_8_;
      (this->m_nonbasicValue).m_backend.exp = local_88.exp;
      (this->m_nonbasicValue).m_backend.neg = local_88.neg;
      (this->m_nonbasicValue).m_backend.fpclass = local_88.fpclass;
      (this->m_nonbasicValue).m_backend.prec_elem = local_88.prec_elem;
      this->m_nonbasicValueUpToDate = true;
    }
    *(undefined8 *)((local_38->m_backend).data._M_elems + 0xc) = local_88.data._M_elems._48_8_;
    *(ulong *)((local_38->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_88.data._M_elems[0xf]._1_3_,local_88.data._M_elems._56_5_);
    *(undefined8 *)((local_38->m_backend).data._M_elems + 8) = local_88.data._M_elems._32_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 10) = local_88.data._M_elems._40_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 4) = local_88.data._M_elems._16_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 6) = local_88.data._M_elems._24_8_;
    *(undefined8 *)(local_38->m_backend).data._M_elems = local_88.data._M_elems._0_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 2) = local_88.data._M_elems._8_8_;
    (local_38->m_backend).exp = local_88.exp;
    (local_38->m_backend).neg = local_88.neg;
    (local_38->m_backend).fpclass = local_88.fpclass;
    (local_38->m_backend).prec_elem = local_88.prec_elem;
    __return_storage_ptr__ = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::nonbasicValue()
   {
      int i;
      StableSum<R> val;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

#ifndef ENABLE_ADDITIONAL_CHECKS

      // if the value is available we don't need to recompute it
      if(m_nonbasicValueUpToDate)
         return m_nonbasicValue;

#endif

      if(rep() == COLUMN)
      {
         if(type() == LEAVE)
         {
            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theUCbound[i] * SPxLPBase<R>::upper(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::upper(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theLCbound[i] * SPxLPBase<R>::lower(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));
                  val += this->maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theLRbound[i] * SPxLPBase<R>::rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theURbound[i] * SPxLPBase<R>::lhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lhs(i), SPxLPBase<R>::rhs(i), this->epsilon()));
                  val += this->maxRowObj(i) * SPxLPBase<R>::lhs(i);
                  break;

               default:
                  break;
               }
            }
         }
         else
         {
            assert(type() == ENTER);

            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxObj(i) * theUCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLCbound[i], theUCbound[i], this->epsilon()));
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxRowObj(i) * theLRbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLRbound[i], theURbound[i], this->epsilon()));
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               default:
                  break;
               }
            }
         }
      }
      else
      {
         assert(rep() == ROW);
         assert(type() == ENTER);

         for(i = this->nCols() - 1; i >= 0; --i)
         {
            switch(ds.colStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theUCbound[i] * this->lower(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLCbound[i] * this->upper(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLCbound[i] * this->upper(i);
               val += theUCbound[i] * this->lower(i);
               break;

            default:
               break;
            }
         }

         for(i = this->nRows() - 1; i >= 0; --i)
         {
            switch(ds.rowStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theURbound[i] * this->lhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLRbound[i] * this->rhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLRbound[i] * this->rhs(i);
               val += theURbound[i] * this->lhs(i);
               break;

            default:
               break;
            }
         }
      }

#ifdef ENABLE_ADDITIONAL_CHECKS

      if(m_nonbasicValueUpToDate && NE(m_nonbasicValue, val))
      {
         SPX_MSG_ERROR(std::cerr << "stored nonbasic value: " << m_nonbasicValue
                       << ", correct nonbasic value: " << val
                       << ", violation: " << val - m_nonbasicValue << std::endl;)
         assert(EQrel(m_nonbasicValue, val, 1e-12));
      }

#endif

      if(!m_nonbasicValueUpToDate)
      {
         m_nonbasicValue = R(val);
         m_nonbasicValueUpToDate = true;
      }

      return val;
   }